

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

int copy_special_str(char *result,_Bool sign,_Bool exponent,_Bool mantissa)

{
  _Bool mantissa_local;
  _Bool exponent_local;
  _Bool sign_local;
  char *result_local;
  
  if (mantissa) {
    result[0] = 'N';
    result[1] = 'a';
    result[2] = 'N';
    result_local._4_4_ = 3;
  }
  else {
    if (sign) {
      *result = '-';
    }
    if (exponent) {
      builtin_strncpy(result + (int)(uint)sign,"Infinity",8);
      result_local._4_4_ = sign + 8;
    }
    else {
      (result + (int)(uint)sign)[0] = '0';
      (result + (int)(uint)sign)[1] = 'E';
      result[(long)(int)(uint)sign + 2] = '0';
      result_local._4_4_ = sign + 3;
    }
  }
  return result_local._4_4_;
}

Assistant:

static inline int copy_special_str(char * const result, const bool sign, const bool exponent, const bool mantissa) {
	if (mantissa) {
		memcpy(result, "NaN", 3);
		return 3;
	}
	if (sign) {
		result[0] = '-';
	}
	if (exponent) {
		memcpy(result + sign, "Infinity", 8);
		return sign + 8;
	}
	memcpy(result + sign, "0E0", 3);
	return sign + 3;
}